

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void image_manipulation::bilinear_resize
               (clip_image_u8 *src,clip_image_u8 *dst,int target_width,int target_height)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong local_58;
  long local_50;
  
  dst->nx = target_width;
  dst->ny = target_height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&dst->buf,(long)(target_width * target_height * 3));
  if (0 < target_height) {
    iVar1 = src->nx;
    iVar2 = src->ny;
    local_50 = 0;
    local_58 = 0;
    do {
      if (0 < target_width) {
        fVar11 = (float)(int)local_58 * ((float)(iVar2 + -1) / (float)target_height);
        uVar9 = 0;
        lVar8 = local_50;
        do {
          fVar12 = (float)(int)uVar9 * ((float)(iVar1 + -1) / (float)target_width);
          iVar10 = (int)fVar12 * 3;
          lVar6 = 0;
          lVar7 = lVar8;
          do {
            puVar3 = (src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar4 = (long)(src->nx * (int)fVar11 + (int)fVar12) * 3;
            iVar5 = src->nx * ((int)fVar11 * 3 + 3);
            fVar13 = ((float)puVar3[(int)lVar4 + (int)lVar6 + 3] - (float)puVar3[lVar6 + lVar4]) *
                     (fVar12 - (float)(int)fVar12) + (float)puVar3[lVar6 + lVar4];
            (dst->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] =
                 (uchar)(int)(((((float)puVar3[iVar5 + iVar10 + 3] - (float)puVar3[iVar5 + iVar10])
                                * (fVar12 - (float)(int)fVar12) + (float)puVar3[iVar5 + iVar10]) -
                              fVar13) * (fVar11 - (float)(int)fVar11) + fVar13);
            lVar6 = lVar6 + 1;
            lVar7 = lVar7 + 1;
            iVar10 = iVar10 + 1;
          } while (lVar6 != 3);
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 3;
        } while (uVar9 != (uint)target_width);
      }
      local_58 = local_58 + 1;
      local_50 = local_50 + (ulong)(uint)target_width * 3;
    } while (local_58 != (uint)target_height);
  }
  return;
}

Assistant:

static void bilinear_resize(const clip_image_u8& src, clip_image_u8& dst, int target_width, int target_height) {
        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float x_ratio = static_cast<float>(src.nx - 1) / target_width;
        float y_ratio = static_cast<float>(src.ny - 1) / target_height;

        for (int y = 0; y < target_height; y++) {
            for (int x = 0; x < target_width; x++) {
                float px = x_ratio * x;
                float py = y_ratio * y;
                int x_floor = static_cast<int>(px);
                int y_floor = static_cast<int>(py);
                float x_lerp = px - x_floor;
                float y_lerp = py - y_floor;

                for (int c = 0; c < 3; c++) {
                    float top = lerp(
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    float bottom = lerp(
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    dst.buf[3 * (y * target_width + x) + c] = static_cast<uint8_t>(lerp(top, bottom, y_lerp));
                }
            }
        }
    }